

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_FabSet.cpp
# Opt level: O2

ssize_t __thiscall amrex::FabSet::read(FabSet *this,int __fd,void *__buf,size_t __nbytes)

{
  element_type *peVar1;
  ssize_t extraout_RAX;
  undefined4 in_register_00000034;
  
  peVar1 = (this->m_mf).super_FabArray<amrex::FArrayBox>.super_FabArrayBase.boxarray.m_ref.
           super___shared_ptr<amrex::BARef,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if ((peVar1->m_abox).super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
      super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.super__Vector_impl_data.
      _M_start ==
      *(pointer *)
       ((long)&(peVar1->m_abox).super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
               super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
               super__Vector_impl_data + 8)) {
    Abort_host("FabSet::read: not predefined");
  }
  VisMF::Read((FabArray<amrex::FArrayBox> *)this,(string *)CONCAT44(in_register_00000034,__fd),
              (char *)0x0,0,0);
  return extraout_RAX;
}

Assistant:

void
FabSet::read(const std::string& name)
{
    if (m_mf.empty()) {
        amrex::Abort("FabSet::read: not predefined");
    }
    VisMF::Read(m_mf,name);
}